

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O2

int __thiscall
WAVEFRONT::OBJ::LoadMesh(OBJ *this,char *fname,GeometryInterface *iface,bool textured)

{
  pointer pfVar1;
  InPlaceParser ipp;
  InPlaceParser IStack_628;
  
  this->mTextured = textured;
  pfVar1 = (this->mVerts).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mVerts).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->mVerts).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar1;
  }
  pfVar1 = (this->mTexels).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mTexels).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->mTexels).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (this->mNormals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mNormals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->mNormals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  this->mCallback = iface;
  InPlaceParser::InPlaceParser(&IStack_628,fname);
  InPlaceParser::Parse(&IStack_628,&this->super_InPlaceParserInterface);
  InPlaceParser::~InPlaceParser(&IStack_628);
  return 0;
}

Assistant:

int OBJ::LoadMesh(const char *fname,GeometryInterface *iface, bool textured)
{
  mTextured = textured;
  int ret = 0;

  mVerts.clear();
  mTexels.clear();
  mNormals.clear();

  mCallback = iface;

  InPlaceParser ipp(fname);

  ipp.Parse(this);

return ret;
}